

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O0

void __thiscall BehaviourTree::Succeed::~Succeed(Succeed *this)

{
  Succeed *this_local;
  
  ~Succeed(this);
  operator_delete(this);
  return;
}

Assistant:

virtual Status run() override {
			Node* child = getChild();
			if (child->dontSkip()) {
				// run at each and every iteration
				const Status s = child->run();
				_lastStatus = s;
				if (s == Status::ERROR || s == Status::RUNNING)
					return s;
			}
			else {
				// if the job has already done, return the status
				// else execute it
				Status s;
				if (child->isCompleted()) {
					s = child->getLastStatus();
				}
				else {
					s = child->run();
					_lastStatus = s;
					if (s != Status::RUNNING)
						_completed = true;
				}
				if (s == Status::ERROR || s == Status::RUNNING)
					return s;
			}
			return Status::SUCCESS;
		}